

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_recover_ovf_at_ip
              (pt_event_decoder *decoder,pt_packet_decoder *pacdec,pt_packet *packet,
              pt_packet_ip *ip,pt_time *time,pt_time_cal *tcal)

{
  uint8_t uVar1;
  undefined3 uVar2;
  pt_config *config_00;
  pt_event *ev_00;
  int errcode;
  pt_event *ev;
  pt_config *config;
  pt_time_cal *tcal_local;
  pt_time *time_local;
  pt_packet_ip *ip_local;
  pt_packet *packet_local;
  pt_packet_decoder *pacdec_local;
  pt_event_decoder *decoder_local;
  
  if ((((decoder == (pt_event_decoder *)0x0) || (pacdec == (pt_packet_decoder *)0x0)) ||
      (packet == (pt_packet *)0x0)) || ((time == (pt_time *)0x0 || (tcal == (pt_time_cal *)0x0)))) {
    decoder_local._4_4_ = -1;
  }
  else {
    config_00 = pt_evt_config(decoder);
    decoder_local._4_4_ = pt_last_ip_update_ip(&decoder->ip,ip,config_00);
    if (-1 < decoder_local._4_4_) {
      ev_00 = pt_evq_standalone(&decoder->evq);
      decoder->event = ev_00;
      if (ev_00 == (pt_event *)0x0) {
        decoder_local._4_4_ = -1;
      }
      else {
        ev_00->type = ptev_overflow;
        decoder_local._4_4_ = pt_evt_event_time(ev_00,&decoder->time);
        if (-1 < decoder_local._4_4_) {
          memcpy(decoder,pacdec,0x128);
          uVar1 = packet->size;
          uVar2 = *(undefined3 *)&packet->field_0x5;
          (decoder->packet).type = packet->type;
          (decoder->packet).size = uVar1;
          *(undefined3 *)&(decoder->packet).field_0x5 = uVar2;
          (decoder->packet).payload.mode = (packet->payload).mode;
          (decoder->packet).payload.tnt.payload = (packet->payload).tnt.payload;
          memcpy(&decoder->time,time,0x30);
          memcpy(&decoder->tcal,tcal,0x40);
          decoder->field_0x72c = decoder->field_0x72c & 0xef | 0x10;
          decoder_local._4_4_ = pt_evt_event_ip(&(ev_00->variant).disabled.ip,ev_00,&decoder->ip);
        }
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_recover_ovf_at_ip(struct pt_event_decoder *decoder,
				    const struct pt_packet_decoder *pacdec,
				    const struct pt_packet *packet,
				    const struct pt_packet_ip *ip,
				    const struct pt_time *time,
				    const struct pt_time_cal *tcal)
{
	const struct pt_config *config;
	struct pt_event *ev;
	int errcode;

	if (!decoder || !pacdec || !packet || !time || !tcal)
		return -pte_internal;

	config = pt_evt_config(decoder);

	errcode = pt_last_ip_update_ip(&decoder->ip, ip, config);
	if (errcode < 0)
		return errcode;

	decoder->event = ev = pt_evq_standalone(&decoder->evq);
	if (!ev)
		return -pte_internal;

	ev->type = ptev_overflow;

	/* We use the decoder's original time for this event. */
	errcode = pt_evt_event_time(ev, &decoder->time);
	if (errcode < 0)
		return errcode;

	decoder->pacdec = *pacdec;
	decoder->packet = *packet;
	decoder->time = *time;
	decoder->tcal = *tcal;
	decoder->enabled = 1;

	return pt_evt_event_ip(&ev->variant.overflow.ip, ev, &decoder->ip);
}